

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_cheat.cpp
# Opt level: O0

void cht_Give(player_t *player,char *name,int amount)

{
  AWeapon *pAVar1;
  PClassWeapon *type_00;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  PClassInventory *pPVar6;
  PClassActor **ppPVar7;
  AInventory *pAVar8;
  AActor *pAVar9;
  ABasicArmorPickup *this;
  AHexenArmor *this_00;
  PClassWeapon *pPVar10;
  PClassActor *pPVar11;
  PClassInventory *pPVar12;
  int local_f4;
  int local_dc;
  double local_b8;
  AInventory *def_2;
  uint i_5;
  AInventory *def_1;
  uint i_4;
  AWeapon *def;
  uint i_3;
  AWeapon *savedpending;
  AKey *key;
  uint i_2;
  AHexenArmor *armor_1;
  ABasicArmorPickup *armor;
  AInventory *ammo;
  PClassAmmo *atype;
  PClassActor *type_1;
  uint i_1;
  PClassActor *type;
  int local_20;
  int i;
  anon_enum_32 giveall;
  int amount_local;
  char *name_local;
  player_t *player_local;
  
  if (player != (player_t *)(&players + (long)consoleplayer * 0x54)) {
    pcVar5 = userinfo_t::GetName(&player->userinfo);
    Printf("%s is a cheater: give %s\n",pcVar5,name);
  }
  if ((player->mo != (APlayerPawn *)0x0) && (0 < player->health)) {
    local_20 = 0;
    iVar3 = strcasecmp(name,"all");
    if (iVar3 == 0) {
      local_20 = 1;
    }
    else {
      iVar3 = strcasecmp(name,"everything");
      if (iVar3 == 0) {
        local_20 = 2;
      }
    }
    iVar3 = strcasecmp(name,"health");
    if (iVar3 == 0) {
      if (amount < 1) {
        iVar3 = APlayerPawn::GetMaxHealth(player->mo);
        (player->mo->super_AActor).health = iVar3;
        player->health = iVar3;
      }
      else {
        (player->mo->super_AActor).health = amount + (player->mo->super_AActor).health;
        player->health = (player->mo->super_AActor).health;
      }
    }
    if ((local_20 != 0) || (iVar3 = strcasecmp(name,"backpack"), iVar3 == 0)) {
      pPVar6 = (PClassInventory *)PClass::FindActor(&gameinfo.backpacktype);
      if (pPVar6 != (PClassInventory *)0x0) {
        AActor::GiveInventory(&player->mo->super_AActor,pPVar6,1,true);
      }
      if (local_20 == 0) {
        return;
      }
    }
    if ((local_20 != 0) || (iVar3 = strcasecmp(name,"ammo"), iVar3 == 0)) {
      for (type_1._4_4_ = 0;
          uVar4 = TArray<PClassActor_*,_PClassActor_*>::Size(&PClassActor::AllActorClasses),
          type_1._4_4_ < uVar4; type_1._4_4_ = type_1._4_4_ + 1) {
        ppPVar7 = TArray<PClassActor_*,_PClassActor_*>::operator[]
                            (&PClassActor::AllActorClasses,(ulong)type_1._4_4_);
        pPVar11 = *ppPVar7;
        if ((pPVar11->super_PClass).ParentClass == AAmmo::RegistrationInfo.MyClass) {
          pAVar8 = AActor::FindInventory(&player->mo->super_AActor,pPVar11,false);
          if (pAVar8 == (AInventory *)0x0) {
            pAVar9 = Spawn(pPVar11);
            (*(pAVar9->super_DThinker).super_DObject._vptr_DObject[0x29])(pAVar9,player->mo);
            *(undefined4 *)&pAVar9[1].super_DThinker.super_DObject.Class =
                 *(undefined4 *)((long)&pAVar9[1].super_DThinker.super_DObject.Class + 4);
          }
          else if (pAVar8->Amount < pAVar8->MaxAmount) {
            pAVar8->Amount = pAVar8->MaxAmount;
          }
        }
      }
      if (local_20 == 0) {
        return;
      }
    }
    if ((local_20 != 0) || (iVar3 = strcasecmp(name,"armor"), iVar3 == 0)) {
      if (gameinfo.gametype == GAME_Hexen) {
        for (type._4_4_ = 0; type._4_4_ < 4; type._4_4_ = type._4_4_ + 1) {
          this_00 = Spawn<AHexenArmor>();
          (this_00->super_AArmor).super_AInventory.super_AActor.health = type._4_4_;
          (this_00->super_AArmor).super_AInventory.Amount = 0;
          bVar2 = AInventory::CallTryPickup
                            ((AInventory *)this_00,&player->mo->super_AActor,(AActor **)0x0);
          if (!bVar2) {
            (*(this_00->super_AArmor).super_AInventory.super_AActor.super_DThinker.super_DObject.
              _vptr_DObject[4])();
          }
        }
      }
      else {
        this = Spawn<ABasicArmorPickup>();
        this->SaveAmount = deh.BlueAC * 100;
        if (gameinfo.Armor2Percent <= 0.0) {
          local_b8 = 0.5;
        }
        else {
          local_b8 = gameinfo.Armor2Percent;
        }
        this->SavePercent = local_b8;
        bVar2 = AInventory::CallTryPickup
                          ((AInventory *)this,&player->mo->super_AActor,(AActor **)0x0);
        if (!bVar2) {
          (*(this->super_AArmor).super_AInventory.super_AActor.super_DThinker.super_DObject.
            _vptr_DObject[4])();
        }
      }
      if (local_20 == 0) {
        return;
      }
    }
    if ((local_20 != 0) || (iVar3 = strcasecmp(name,"keys"), iVar3 == 0)) {
      for (key._4_4_ = 0;
          uVar4 = TArray<PClassActor_*,_PClassActor_*>::Size(&PClassActor::AllActorClasses),
          key._4_4_ < uVar4; key._4_4_ = key._4_4_ + 1) {
        ppPVar7 = TArray<PClassActor_*,_PClassActor_*>::operator[]
                            (&PClassActor::AllActorClasses,(ulong)key._4_4_);
        bVar2 = PClass::IsDescendantOf(&(*ppPVar7)->super_PClass,AKey::RegistrationInfo.MyClass);
        if (bVar2) {
          ppPVar7 = TArray<PClassActor_*,_PClassActor_*>::operator[]
                              (&PClassActor::AllActorClasses,(ulong)key._4_4_);
          pAVar9 = GetDefaultByType(&(*ppPVar7)->super_PClass);
          if (*(char *)((long)&pAVar9[1].snext + 4) != '\0') {
            ppPVar7 = TArray<PClassActor_*,_PClassActor_*>::operator[]
                                (&PClassActor::AllActorClasses,(ulong)key._4_4_);
            pAVar8 = (AInventory *)Spawn(*ppPVar7);
            bVar2 = AInventory::CallTryPickup(pAVar8,&player->mo->super_AActor,(AActor **)0x0);
            if (!bVar2) {
              (*(pAVar8->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
            }
          }
        }
      }
      if (local_20 == 0) {
        return;
      }
    }
    if ((local_20 != 0) || (iVar3 = strcasecmp(name,"weapons"), iVar3 == 0)) {
      pAVar1 = player->PendingWeapon;
      for (def._4_4_ = 0;
          uVar4 = TArray<PClassActor_*,_PClassActor_*>::Size(&PClassActor::AllActorClasses),
          def._4_4_ < uVar4; def._4_4_ = def._4_4_ + 1) {
        ppPVar7 = TArray<PClassActor_*,_PClassActor_*>::operator[]
                            (&PClassActor::AllActorClasses,(ulong)def._4_4_);
        type_00 = (PClassWeapon *)*ppPVar7;
        if ((type_00 != (PClassWeapon *)AWeapon::RegistrationInfo.MyClass) &&
           (bVar2 = PClass::IsDescendantOf((PClass *)type_00,AWeapon::RegistrationInfo.MyClass),
           bVar2)) {
          pPVar10 = (PClassWeapon *)PClassActor::GetReplacement((PClassActor *)type_00,true);
          if (pPVar10 != type_00) {
            pPVar11 = PClassActor::GetReplacement((PClassActor *)type_00,true);
            bVar2 = PClass::IsDescendantOf
                              (&pPVar11->super_PClass,ADehackedPickup::RegistrationInfo.MyClass);
            if (!bVar2) goto LAB_004c3446;
          }
          bVar2 = FWeaponSlots::LocateWeapon(&player->weapons,type_00,(int *)0x0,(int *)0x0);
          if ((bVar2) &&
             ((pAVar9 = GetDefaultByType((PClass *)type_00), local_20 == 2 ||
              (((ulong)pAVar9[1].snext & 0x800000000000000) == 0)))) {
            AActor::GiveInventory(&player->mo->super_AActor,(PClassInventory *)type_00,1,true);
          }
        }
LAB_004c3446:
      }
      player->PendingWeapon = pAVar1;
      if (local_20 == 0) {
        return;
      }
    }
    if ((local_20 != 0) || (iVar3 = strcasecmp(name,"artifacts"), iVar3 == 0)) {
      for (def_1._4_4_ = 0;
          uVar4 = TArray<PClassActor_*,_PClassActor_*>::Size(&PClassActor::AllActorClasses),
          def_1._4_4_ < uVar4; def_1._4_4_ = def_1._4_4_ + 1) {
        ppPVar7 = TArray<PClassActor_*,_PClassActor_*>::operator[]
                            (&PClassActor::AllActorClasses,(ulong)def_1._4_4_);
        pPVar6 = (PClassInventory *)*ppPVar7;
        bVar2 = PClass::IsDescendantOf((PClass *)pPVar6,AInventory::RegistrationInfo.MyClass);
        if (bVar2) {
          pAVar9 = GetDefaultByType((PClass *)pPVar6);
          bVar2 = FTextureID::isValid((FTextureID *)&pAVar9[1].super_DThinker.super_DObject.GCNext);
          if (((((bVar2) && (1 < *(int *)((long)&pAVar9[1].super_DThinker.super_DObject.Class + 4)))
               && (bVar2 = PClass::IsDescendantOf
                                     ((PClass *)pPVar6,APuzzleItem::RegistrationInfo.MyClass),
                  !bVar2)) &&
              ((bVar2 = PClass::IsDescendantOf((PClass *)pPVar6,APowerup::RegistrationInfo.MyClass),
               !bVar2 && (bVar2 = PClass::IsDescendantOf
                                            ((PClass *)pPVar6,AArmor::RegistrationInfo.MyClass),
                         !bVar2)))) &&
             ((local_20 == 2 ||
              (pPVar12 = (PClassInventory *)PClassActor::GetReplacement((PClassActor *)pPVar6,true),
              pPVar12 == pPVar6)))) {
            local_dc = amount;
            if (amount < 1) {
              local_dc = *(int *)((long)&pAVar9[1].super_DThinker.super_DObject.Class + 4);
            }
            AActor::GiveInventory(&player->mo->super_AActor,pPVar6,local_dc,true);
          }
        }
      }
      if (local_20 == 0) {
        return;
      }
    }
    if ((local_20 != 0) || (iVar3 = strcasecmp(name,"puzzlepieces"), iVar3 == 0)) {
      for (def_2._4_4_ = 0;
          uVar4 = TArray<PClassActor_*,_PClassActor_*>::Size(&PClassActor::AllActorClasses),
          def_2._4_4_ < uVar4; def_2._4_4_ = def_2._4_4_ + 1) {
        ppPVar7 = TArray<PClassActor_*,_PClassActor_*>::operator[]
                            (&PClassActor::AllActorClasses,(ulong)def_2._4_4_);
        pPVar6 = (PClassInventory *)*ppPVar7;
        bVar2 = PClass::IsDescendantOf((PClass *)pPVar6,APuzzleItem::RegistrationInfo.MyClass);
        if (bVar2) {
          pAVar9 = GetDefaultByType((PClass *)pPVar6);
          bVar2 = FTextureID::isValid((FTextureID *)&pAVar9[1].super_DThinker.super_DObject.GCNext);
          if ((bVar2) &&
             ((local_20 == 2 ||
              (pPVar12 = (PClassInventory *)PClassActor::GetReplacement((PClassActor *)pPVar6,true),
              pPVar12 == pPVar6)))) {
            local_f4 = amount;
            if (amount < 1) {
              local_f4 = *(int *)((long)&pAVar9[1].super_DThinker.super_DObject.Class + 4);
            }
            AActor::GiveInventory(&player->mo->super_AActor,pPVar6,local_f4,true);
          }
        }
      }
      if (local_20 == 0) {
        return;
      }
    }
    if (local_20 == 0) {
      pPVar6 = (PClassInventory *)PClass::FindActor(name);
      if ((pPVar6 == (PClassInventory *)0x0) ||
         (bVar2 = PClass::IsDescendantOf((PClass *)pPVar6,AInventory::RegistrationInfo.MyClass),
         !bVar2)) {
        if (player == (player_t *)(&players + (long)consoleplayer * 0x54)) {
          Printf("Unknown item \"%s\"\n",name);
        }
      }
      else {
        AActor::GiveInventory(&player->mo->super_AActor,pPVar6,amount,true);
      }
    }
  }
  return;
}

Assistant:

void cht_Give (player_t *player, const char *name, int amount)
{
	enum { ALL_NO, ALL_YES, ALL_YESYES } giveall;
	int i;
	PClassActor *type;

	if (player != &players[consoleplayer])
		Printf ("%s is a cheater: give %s\n", player->userinfo.GetName(), name);

	if (player->mo == NULL || player->health <= 0)
	{
		return;
	}

	giveall = ALL_NO;
	if (stricmp (name, "all") == 0)
	{
		giveall = ALL_YES;
	}
	else if (stricmp (name, "everything") == 0)
	{
		giveall = ALL_YESYES;
	}

	if (stricmp (name, "health") == 0)
	{
		if (amount > 0)
		{
			player->mo->health += amount;
			player->health = player->mo->health;
		}
		else
		{
			player->health = player->mo->health = player->mo->GetMaxHealth();
		}
	}

	if (giveall || stricmp (name, "backpack") == 0)
	{
		// Select the correct type of backpack based on the game
		type = PClass::FindActor(gameinfo.backpacktype);
		if (type != NULL)
		{
			player->mo->GiveInventory(static_cast<PClassInventory *>(type), 1, true);
		}

		if (!giveall)
			return;
	}

	if (giveall || stricmp (name, "ammo") == 0)
	{
		// Find every unique type of ammo. Give it to the player if
		// he doesn't have it already, and set each to its maximum.
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			PClassActor *type = PClassActor::AllActorClasses[i];

			if (type->ParentClass == RUNTIME_CLASS(AAmmo))
			{
				PClassAmmo *atype = static_cast<PClassAmmo *>(type);
				AInventory *ammo = player->mo->FindInventory(atype);
				if (ammo == NULL)
				{
					ammo = static_cast<AInventory *>(Spawn (atype));
					ammo->AttachToOwner (player->mo);
					ammo->Amount = ammo->MaxAmount;
				}
				else if (ammo->Amount < ammo->MaxAmount)
				{
					ammo->Amount = ammo->MaxAmount;
				}
			}
		}

		if (!giveall)
			return;
	}

	if (giveall || stricmp (name, "armor") == 0)
	{
		if (gameinfo.gametype != GAME_Hexen)
		{
			ABasicArmorPickup *armor = Spawn<ABasicArmorPickup> ();
			armor->SaveAmount = 100*deh.BlueAC;
			armor->SavePercent = gameinfo.Armor2Percent > 0? gameinfo.Armor2Percent : 0.5;
			if (!armor->CallTryPickup (player->mo))
			{
				armor->Destroy ();
			}
		}
		else
		{
			for (i = 0; i < 4; ++i)
			{
				AHexenArmor *armor = Spawn<AHexenArmor> ();
				armor->health = i;
				armor->Amount = 0;
				if (!armor->CallTryPickup (player->mo))
				{
					armor->Destroy ();
				}
			}
		}

		if (!giveall)
			return;
	}

	if (giveall || stricmp (name, "keys") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			if (PClassActor::AllActorClasses[i]->IsDescendantOf (RUNTIME_CLASS(AKey)))
			{
				AKey *key = (AKey *)GetDefaultByType (PClassActor::AllActorClasses[i]);
				if (key->KeyNumber != 0)
				{
					key = static_cast<AKey *>(Spawn(static_cast<PClassActor *>(PClassActor::AllActorClasses[i])));
					if (!key->CallTryPickup (player->mo))
					{
						key->Destroy ();
					}
				}
			}
		}
		if (!giveall)
			return;
	}

	if (giveall || stricmp (name, "weapons") == 0)
	{
		AWeapon *savedpending = player->PendingWeapon;
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			type = PClassActor::AllActorClasses[i];
			// Don't give replaced weapons unless the replacement was done by Dehacked.
			if (type != RUNTIME_CLASS(AWeapon) &&
				type->IsDescendantOf (RUNTIME_CLASS(AWeapon)) &&
				(static_cast<PClassActor *>(type)->GetReplacement() == type ||
				 static_cast<PClassActor *>(type)->GetReplacement()->IsDescendantOf(RUNTIME_CLASS(ADehackedPickup))))
			{
				// Give the weapon only if it belongs to the current game or
				if (player->weapons.LocateWeapon(static_cast<PClassWeapon*>(type), NULL, NULL))
				{
					AWeapon *def = (AWeapon*)GetDefaultByType (type);
					if (giveall == ALL_YESYES || !(def->WeaponFlags & WIF_CHEATNOTWEAPON))
					{
						player->mo->GiveInventory(static_cast<PClassInventory *>(type), 1, true);
					}
				}
			}
		}
		player->PendingWeapon = savedpending;

		if (!giveall)
			return;
	}

	if (giveall || stricmp (name, "artifacts") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			type = PClassActor::AllActorClasses[i];
			if (type->IsDescendantOf (RUNTIME_CLASS(AInventory)))
			{
				AInventory *def = (AInventory*)GetDefaultByType (type);
				if (def->Icon.isValid() && def->MaxAmount > 1 &&
					!type->IsDescendantOf (RUNTIME_CLASS(APuzzleItem)) &&
					!type->IsDescendantOf (RUNTIME_CLASS(APowerup)) &&
					!type->IsDescendantOf (RUNTIME_CLASS(AArmor)))
				{
					// Do not give replaced items unless using "give everything"
					if (giveall == ALL_YESYES || type->GetReplacement() == type)
					{
						player->mo->GiveInventory(static_cast<PClassInventory *>(type), amount <= 0 ? def->MaxAmount : amount, true);
					}
				}
			}
		}
		if (!giveall)
			return;
	}

	if (giveall || stricmp (name, "puzzlepieces") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			type = PClassActor::AllActorClasses[i];
			if (type->IsDescendantOf (RUNTIME_CLASS(APuzzleItem)))
			{
				AInventory *def = (AInventory*)GetDefaultByType (type);
				if (def->Icon.isValid())
				{
					// Do not give replaced items unless using "give everything"
					if (giveall == ALL_YESYES || type->GetReplacement() == type)
					{
						player->mo->GiveInventory(static_cast<PClassInventory *>(type), amount <= 0 ? def->MaxAmount : amount, true);
					}
				}
			}
		}
		if (!giveall)
			return;
	}

	if (giveall)
		return;

	type = PClass::FindActor(name);
	if (type == NULL || !type->IsDescendantOf (RUNTIME_CLASS(AInventory)))
	{
		if (player == &players[consoleplayer])
			Printf ("Unknown item \"%s\"\n", name);
	}
	else
	{
		player->mo->GiveInventory(static_cast<PClassInventory *>(type), amount, true);
	}
	return;
}